

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_phase_callback_registry.cpp
# Opt level: O1

mask_type __thiscall
sc_core::sc_phase_callback_registry::register_callback
          (sc_phase_callback_registry *this,cb_type *cb,mask_type m)

{
  pointer *ppeVar1;
  pointer *pppsVar2;
  entry *peVar3;
  iterator __position;
  iterator iVar4;
  mask_type mVar5;
  long lVar6;
  entry *peVar7;
  entry *peVar8;
  uint uVar9;
  entry new_entry;
  value_type local_38;
  
  peVar8 = (this->m_cb_vec).
           super__Vector_base<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar3 = (this->m_cb_vec).
           super__Vector_base<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)peVar3 - (long)peVar8 >> 6;
  peVar7 = peVar8;
  if (0 < lVar6) {
    peVar7 = (entry *)((long)&peVar8->target + ((long)peVar3 - (long)peVar8 & 0xffffffffffffffc0U));
    lVar6 = lVar6 + 1;
    peVar8 = peVar8 + 2;
    do {
      if (peVar8[-2].target == cb) {
        peVar8 = peVar8 + -2;
        goto LAB_001faaa8;
      }
      if (peVar8[-1].target == cb) {
        peVar8 = peVar8 + -1;
        goto LAB_001faaa8;
      }
      if (peVar8->target == cb) goto LAB_001faaa8;
      if (peVar8[1].target == cb) {
        peVar8 = peVar8 + 1;
        goto LAB_001faaa8;
      }
      lVar6 = lVar6 + -1;
      peVar8 = peVar8 + 4;
    } while (1 < lVar6);
  }
  lVar6 = (long)peVar3 - (long)peVar7 >> 4;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      peVar8 = peVar3;
      if ((lVar6 != 3) || (peVar8 = peVar7, peVar7->target == cb)) goto LAB_001faaa8;
      peVar7 = peVar7 + 1;
    }
    peVar8 = peVar7;
    if (peVar7->target == cb) goto LAB_001faaa8;
    peVar7 = peVar7 + 1;
  }
  peVar8 = peVar7;
  if (peVar7->target != cb) {
    peVar8 = peVar3;
  }
LAB_001faaa8:
  mVar5 = validate_mask(this,cb,m,true);
  __position._M_current =
       (this->m_cb_vec).
       super__Vector_base<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (peVar8 == __position._M_current) {
    if (mVar5 == 0) {
      return 0;
    }
    uVar9 = mVar5;
    local_38.mask = mVar5;
    if (__position._M_current ==
        (this->m_cb_vec).
        super__Vector_base<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_38.target = cb;
      std::
      vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>
      ::_M_realloc_insert(&this->m_cb_vec,__position,&local_38);
    }
    else {
      (__position._M_current)->target = cb;
      *(ulong *)&(__position._M_current)->mask = CONCAT44(local_38._12_4_,mVar5);
      ppeVar1 = &(this->m_cb_vec).
                 super__Vector_base<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppeVar1 = *ppeVar1 + 1;
    }
  }
  else {
    uVar9 = peVar8->mask | mVar5;
    mVar5 = mVar5 & ~peVar8->mask;
    peVar8->mask = uVar9;
  }
  if ((mVar5 >> 10 & 1) != 0) {
    iVar4._M_current =
         (this->m_cb_update_vec).
         super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (this->m_cb_update_vec).
        super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_38.target = cb;
      std::vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>::_M_realloc_insert
                (&this->m_cb_update_vec,iVar4,&local_38.target);
    }
    else {
      *iVar4._M_current = cb;
      pppsVar2 = &(this->m_cb_update_vec).
                  super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppsVar2 = *pppsVar2 + 1;
    }
  }
  if ((mVar5 >> 0xb & 1) != 0) {
    iVar4._M_current =
         (this->m_cb_timestep_vec).
         super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (this->m_cb_timestep_vec).
        super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_38.target = cb;
      std::vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>::_M_realloc_insert
                (&this->m_cb_timestep_vec,iVar4,&local_38.target);
    }
    else {
      *iVar4._M_current = cb;
      pppsVar2 = &(this->m_cb_timestep_vec).
                  super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppsVar2 = *pppsVar2 + 1;
    }
  }
  return uVar9;
}

Assistant:

sc_phase_callback_registry::mask_type
sc_phase_callback_registry::register_callback( cb_type& cb, mask_type m )
{
    storage_type::iterator it =
      find_if( m_cb_vec.begin(), m_cb_vec.end(), entry_match(&cb) );

    m = validate_mask(cb, m, /* warn */ true );

    mask_type diff_mask = m;
    mask_type new_mask  = m;

    if( it != m_cb_vec.end() ) // update existing entry
    {
        // update masks
        new_mask   =  (*it).mask | m;
        diff_mask  = ~(*it).mask & m;
        (*it).mask = new_mask;
    }
    else // new entry
    {
        if( !m ) // empty, do nothing
            return SC_UNITIALIZED;

        entry new_entry = { &cb, new_mask };
        m_cb_vec.push_back( new_entry );
    }

    // add to callback shortcut sets
#if 0
    if( diff_mask & SC_END_OF_EVALUATION )
        m_cb_eval_vec.push_back( &cb );
#endif
    if( diff_mask & SC_END_OF_UPDATE )
        m_cb_update_vec.push_back( &cb );
    if( diff_mask & SC_BEFORE_TIMESTEP )
        m_cb_timestep_vec.push_back( &cb );

    return new_mask;
}